

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

void __thiscall
nonstd::optional_lite::detail::storage_t<tinyusdz::ascii::AsciiParser::VariableDef>::destruct_value
          (storage_t<tinyusdz::ascii::AsciiParser::VariableDef> *this)

{
  value_type *this_00;
  storage_t<tinyusdz::ascii::AsciiParser::VariableDef> *this_local;
  
  this_00 = value_ptr(this);
  tinyusdz::ascii::AsciiParser::VariableDef::~VariableDef(this_00);
  return;
}

Assistant:

void destruct_value()
    {
        value_ptr()->~T();
    }